

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O3

parser_error parse_prefs_keymap_input(parser *p)

{
  keypress trigger;
  parser_error pVar1;
  wchar_t keymap;
  char *pcVar2;
  char *str;
  keypress tmp [2];
  keypress local_38;
  int local_2c;
  
  pcVar2 = (char *)parser_priv(p);
  if (pcVar2 != (char *)0x0) {
    pVar1 = PARSE_ERROR_NONE;
    if (*pcVar2 == '\0') {
      keymap = parser_getint(p,"mode");
      pVar1 = PARSE_ERROR_OUT_OF_BOUNDS;
      if ((uint)keymap < 2) {
        str = parser_getstr(p,"key");
        keypress_from_text(&local_38,2,str);
        pVar1 = PARSE_ERROR_FIELD_TOO_LONG;
        if ((local_38.type == EVT_KBRD) && (local_2c == 0)) {
          trigger.code = local_38.code;
          trigger.mods = local_38.mods;
          trigger._9_3_ = local_38._9_3_;
          trigger.type = EVT_KBRD;
          keymap_add(keymap,trigger,(keypress *)(pcVar2 + 4),(_Bool)pcVar2[0xf4]);
          pVar1 = PARSE_ERROR_NONE;
        }
      }
    }
    return pVar1;
  }
  __assert_fail("d != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-prefs.c"
                ,0x3d2,"enum parser_error parse_prefs_keymap_input(struct parser *)");
}

Assistant:

static enum parser_error parse_prefs_keymap_input(struct parser *p)
{
	int mode;
	struct keypress tmp[2];

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	mode = parser_getint(p, "mode");
	if (mode < 0 || mode >= KEYMAP_MODE_MAX)
		return PARSE_ERROR_OUT_OF_BOUNDS;

	keypress_from_text(tmp, N_ELEMENTS(tmp), parser_getstr(p, "key"));
	if (tmp[0].type != EVT_KBRD || tmp[1].type != EVT_NONE)
		return PARSE_ERROR_FIELD_TOO_LONG;

	keymap_add(mode, tmp[0], d->keymap_buffer, d->user);

	return PARSE_ERROR_NONE;
}